

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

ITexture * __thiscall
irr::video::CNullDriver::addTexture
          (CNullDriver *this,dimension2d<unsigned_int> *size,path *name,ECOLOR_FORMAT format)

{
  bool bVar1;
  u32 uVar2;
  int iVar3;
  CNullDriver *image_00;
  undefined4 extraout_var;
  undefined8 in_RDX;
  CNullDriver *in_RDI;
  double __x;
  ITexture *t;
  IImage *image;
  undefined8 in_stack_ffffffffffffffc8;
  ECOLOR_FORMAT format_00;
  CImage *in_stack_ffffffffffffffd0;
  CNullDriver *this_00;
  ITexture *local_8;
  
  format_00 = (ECOLOR_FORMAT)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  uVar2 = core::string<char>::size((string<char> *)0x30975b);
  if (uVar2 == 0) {
    os::Printer::log((Printer *)"Could not create ITexture, texture needs to have a non-empty name."
                     ,__x);
    local_8 = (ITexture *)0x0;
  }
  else {
    image_00 = (CNullDriver *)operator_new(0x50);
    CImage::CImage(in_stack_ffffffffffffffd0,format_00,(dimension2d<unsigned_int> *)in_RDI);
    local_8 = (ITexture *)0x0;
    this_00 = image_00;
    bVar1 = checkImage(in_RDI,(IImage *)image_00);
    if (bVar1) {
      iVar3 = (*(in_RDI->super_IVideoDriver)._vptr_IVideoDriver[0x75])(in_RDI,in_RDX,this_00);
      local_8 = (ITexture *)CONCAT44(extraout_var,iVar3);
    }
    IReferenceCounted::drop((IReferenceCounted *)image_00);
    if (local_8 != (ITexture *)0x0) {
      addTexture(this_00,local_8);
      IReferenceCounted::drop((IReferenceCounted *)image_00);
    }
  }
  return local_8;
}

Assistant:

ITexture *CNullDriver::addTexture(const core::dimension2d<u32> &size, const io::path &name, ECOLOR_FORMAT format)
{
	if (0 == name.size()) {
		os::Printer::log("Could not create ITexture, texture needs to have a non-empty name.", ELL_WARNING);
		return 0;
	}

	IImage *image = new CImage(format, size);
	ITexture *t = 0;

	if (checkImage(image)) {
		t = createDeviceDependentTexture(name, image);
	}

	image->drop();

	if (t) {
		addTexture(t);
		t->drop();
	}

	return t;
}